

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O1

void VP8SSIMDspInitSSE2(void)

{
  VP8AccumulateSSE = AccumulateSSE_SSE2;
  VP8SSIMGet = SSIMGet_SSE2;
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8SSIMDspInitSSE2(void) {
#if !defined(WEBP_DISABLE_STATS)
  VP8AccumulateSSE = AccumulateSSE_SSE2;
#endif
#if !defined(WEBP_REDUCE_SIZE)
  VP8SSIMGet = SSIMGet_SSE2;
#endif
}